

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mems.cpp
# Opt level: O2

void __thiscall Mems::give_every_mirror_a_sample_slow(Mems *this)

{
  __normal_iterator<Mirror_*,_std::vector<Mirror,_std::allocator<Mirror>_>_> __first;
  __normal_iterator<Mirror_*,_std::vector<Mirror,_std::allocator<Mirror>_>_> __last;
  double *pdVar1;
  pointer pPVar2;
  value_type *__x;
  const_iterator __position;
  double dVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  ostream *poVar6;
  int it;
  pointer pMVar7;
  long lVar8;
  long lVar9;
  
  std::operator<<((ostream *)&std::cout,"\n");
  poVar6 = std::operator<<((ostream *)&std::cout,"give every mirror a sample");
  poVar6 = std::operator<<(poVar6,"\n");
  std::operator<<(poVar6,"\n");
  std::
  __sort<__gnu_cxx::__normal_iterator<Mirror*,std::vector<Mirror,std::allocator<Mirror>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(Mirror_const&,Mirror_const&)>>
            ((this->_mems_mirrors).super__Vector_base<Mirror,_std::allocator<Mirror>_>._M_impl.
             super__Vector_impl_data._M_start,
             (this->_mems_mirrors).super__Vector_base<Mirror,_std::allocator<Mirror>_>._M_impl.
             super__Vector_impl_data._M_finish,
             (_Iter_comp_iter<bool_(*)(const_Mirror_&,_const_Mirror_&)>)0x10e506);
  while( true ) {
    __first._M_current =
         (this->_mems_mirrors).super__Vector_base<Mirror,_std::allocator<Mirror>_>._M_impl.
         super__Vector_impl_data._M_start;
    __last._M_current =
         (this->_mems_mirrors).super__Vector_base<Mirror,_std::allocator<Mirror>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if ((ulong)((long)__last._M_current - (long)__first._M_current) <=
        (ulong)((long)(this->_mems_mirrors_randomrasterized).
                      super__Vector_base<Mirror,_std::allocator<Mirror>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)(this->_mems_mirrors_randomrasterized).
                     super__Vector_base<Mirror,_std::allocator<Mirror>_>._M_impl.
                     super__Vector_impl_data._M_start)) break;
    std::
    __sort<__gnu_cxx::__normal_iterator<Mirror*,std::vector<Mirror,std::allocator<Mirror>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(Mirror_const&,Mirror_const&)>>
              (__first,__last,(_Iter_comp_iter<bool_(*)(const_Mirror_&,_const_Mirror_&)>)0x10e542);
    poVar6 = std::operator<<((ostream *)&std::cout,"Mirror with smallest ammount of samples has  ");
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    poVar6 = std::operator<<(poVar6," samples. ");
    std::operator<<(poVar6,"\n");
    for (pMVar7 = (this->_mems_mirrors).super__Vector_base<Mirror,_std::allocator<Mirror>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pMVar7 != (this->_mems_mirrors).super__Vector_base<Mirror,_std::allocator<Mirror>_>._M_impl.
                  super__Vector_impl_data._M_finish; pMVar7 = pMVar7 + 1) {
      std::
      __sort<__gnu_cxx::__normal_iterator<Point_d*,std::vector<Point_d,std::allocator<Point_d>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(Point_d_const&,Point_d_const&)>>
                ((pMVar7->_matching_samples).super__Vector_base<Point_d,_std::allocator<Point_d>_>.
                 _M_impl.super__Vector_impl_data._M_start,
                 (pMVar7->_matching_samples).super__Vector_base<Point_d,_std::allocator<Point_d>_>.
                 _M_impl.super__Vector_impl_data._M_finish,
                 (_Iter_comp_iter<bool_(*)(const_Point_d_&,_const_Point_d_&)>)0x10e551);
    }
    pMVar7 = (this->_mems_mirrors).super__Vector_base<Mirror,_std::allocator<Mirror>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar1 = *(double **)
              &(pMVar7->_matching_samples).super__Vector_base<Point_d,_std::allocator<Point_d>_>.
               _M_impl;
    dVar3 = pdVar1[1];
    uVar4 = *(undefined8 *)((long)pdVar1 + 0xc);
    uVar5 = *(undefined8 *)((long)pdVar1 + 0x14);
    (pMVar7->_displayed_sample).x = *pdVar1;
    (pMVar7->_displayed_sample).y = dVar3;
    *(undefined8 *)((long)&(pMVar7->_displayed_sample).y + 4) = uVar4;
    *(undefined8 *)((long)&(pMVar7->_displayed_sample).dis + 4) = uVar5;
    pMVar7 = (this->_mems_mirrors).super__Vector_base<Mirror,_std::allocator<Mirror>_>._M_impl.
             super__Vector_impl_data._M_start;
    pMVar7->has_sample = true;
    pPVar2 = *(pointer *)
              &(pMVar7->_matching_samples).super__Vector_base<Point_d,_std::allocator<Point_d>_>.
               _M_impl;
    if (*(pointer *)
         ((long)&(pMVar7->_matching_samples).super__Vector_base<Point_d,_std::allocator<Point_d>_> +
         8) != pPVar2) {
      *(pointer *)
       ((long)&(pMVar7->_matching_samples).super__Vector_base<Point_d,_std::allocator<Point_d>_> + 8
       ) = pPVar2;
    }
    ((this->_mems_mirrors).super__Vector_base<Mirror,_std::allocator<Mirror>_>._M_impl.
     super__Vector_impl_data._M_start)->_ammount_of_matching_samples = 0xd9038;
    std::operator<<((ostream *)&std::cout,"_mems_mirror.begin() on pos: x: ");
    poVar6 = std::ostream::_M_insert<double>
                       ((((this->_mems_mirrors).super__Vector_base<Mirror,_std::allocator<Mirror>_>.
                          _M_impl.super__Vector_impl_data._M_start)->_position).x);
    std::operator<<(poVar6," y: ");
    poVar6 = std::ostream::_M_insert<double>
                       ((((this->_mems_mirrors).super__Vector_base<Mirror,_std::allocator<Mirror>_>.
                          _M_impl.super__Vector_impl_data._M_start)->_position).y);
    std::operator<<(poVar6,"\n");
    std::operator<<((ostream *)&std::cout,"_mems_mirror.begin() shows now: x: ");
    poVar6 = std::ostream::_M_insert<double>
                       ((((this->_mems_mirrors).super__Vector_base<Mirror,_std::allocator<Mirror>_>.
                          _M_impl.super__Vector_impl_data._M_start)->_displayed_sample).x);
    std::operator<<(poVar6," y: ");
    poVar6 = std::ostream::_M_insert<double>
                       ((((this->_mems_mirrors).super__Vector_base<Mirror,_std::allocator<Mirror>_>.
                          _M_impl.super__Vector_impl_data._M_start)->_displayed_sample).y);
    std::operator<<(poVar6,"\n");
    lVar9 = 0x28;
    for (lVar8 = 0;
        __x = (this->_mems_mirrors).super__Vector_base<Mirror,_std::allocator<Mirror>_>._M_impl.
              super__Vector_impl_data._M_start,
        lVar8 != ((long)(this->_mems_mirrors).super__Vector_base<Mirror,_std::allocator<Mirror>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)__x) / 0x88;
        lVar8 = lVar8 + 1) {
      if (((*(char *)((long)&__x->_ammount_of_matching_samples + lVar9) == '\0') &&
          (__position._M_current = *(Point_d **)((long)&__x->id + lVar9),
          *(Point_d **)((long)&(__x->_position).x + lVar9) != __position._M_current)) &&
         ((__x->_displayed_sample).id == (__position._M_current)->id)) {
        std::vector<Point_d,_std::allocator<Point_d>_>::erase
                  ((vector<Point_d,_std::allocator<Point_d>_> *)((long)&__x->id + lVar9),__position)
        ;
        std::operator<<((ostream *)&std::cout,"sample erased  ");
      }
      lVar9 = lVar9 + 0x88;
    }
    std::vector<Mirror,_std::allocator<Mirror>_>::push_back
              (&this->_mems_mirrors_randomrasterized,__x);
    poVar6 = std::operator<<((ostream *)&std::cout,"new mirrorvector has size: ");
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    poVar6 = std::operator<<(poVar6,"\n");
    poVar6 = std::operator<<(poVar6,"\n");
    poVar6 = std::operator<<(poVar6,"\n");
    std::operator<<(poVar6,"\n");
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<Mirror*,std::vector<Mirror,std::allocator<Mirror>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(Mirror_const&,Mirror_const&)>>
            (__first,__last,(_Iter_comp_iter<bool_(*)(const_Mirror_&,_const_Mirror_&)>)0x10e522);
  poVar6 = std::operator<<((ostream *)&std::cout,"give every mirror a sample ends now. ");
  std::operator<<(poVar6,"\n");
  return;
}

Assistant:

void Mems::give_every_mirror_a_sample_slow(){
      std::cout<<"\n";

      std::cout<<"give every mirror a sample"<< "\n"<< "\n";
      std::sort(_mems_mirrors.begin(), _mems_mirrors.end(), compare_by_ammount_of_matching_samples);

      while(_mems_mirrors_randomrasterized.size() < _mems_mirrors.size())
      {
  //      std::cout<<"Pixels left: "<<_mems_mirrors.size()<<"\n";
        //sorting mems for sample availability
        std::sort(_mems_mirrors.begin(), _mems_mirrors.end(), compare_by_ammount);

        std::cout << "Mirror with smallest ammount of samples has  " <<_mems_mirrors.begin()->_matching_samples.size()<<" samples. " <<"\n";
        //gehe durch alle spiegel und sortiere ihren sample vector der größe nach
        for(auto mirror = std::begin(_mems_mirrors); mirror != std::end(_mems_mirrors); ++mirror)
        {
          std::sort(mirror->_matching_samples.begin(), mirror->_matching_samples.end(), compare_by_distance);
        }

        // give first mirror(am wenigsten matches) sample_displayed which is at matching samples first position
        _mems_mirrors.begin()->_displayed_sample = _mems_mirrors.begin()->_matching_samples.front();
        _mems_mirrors.begin()->has_sample = true;
        _mems_mirrors.begin()->_matching_samples.clear();
        _mems_mirrors.begin()->_ammount_of_matching_samples = 888888;
        std::cout<<"_mems_mirror.begin() on pos: x: "<<_mems_mirrors.begin()->_position.x<<" y: "<<_mems_mirrors.begin()->_position.y<<"\n";
        std::cout<<"_mems_mirror.begin() shows now: x: "<<_mems_mirrors.begin()->_displayed_sample.x<<" y: "<<_mems_mirrors.begin()->_displayed_sample.y<<"\n";

        //point aus allen umliegenden mirrors als available point löschen

        for(int it = 0; it != _mems_mirrors.size(); ++it){
          //std::cout<<"mi erased0  ";
          if(_mems_mirrors[it].has_sample == false){

            for(int mi = 0; mi != _mems_mirrors[it]._matching_samples.size(); ++mi){

              if(_mems_mirrors.begin()->_displayed_sample.id == _mems_mirrors[it]._matching_samples[mi].id){
              /*  std::cout<< "matching samples size before erase: "<< _mems_mirrors[it]._matching_samples.size()<<"\n";
                for( auto debug = std::begin(_mems_mirrors[it]._matching_samples); debug != std::end(_mems_mirrors[it]._matching_samples); ++debug){
                  std::cout<<debug->id<<" is id of sample "<<"\n";
                }
                */
                _mems_mirrors[it]._matching_samples.erase(_mems_mirrors[it]._matching_samples.begin()+ mi);
              //  it->_ammount_of_matching_samples = it->_matching_samples.size();
                std::cout<<"sample erased  ";

              /*  std::cout<< "matching samples size after erase: "<< _mems_mirrors[it]._matching_samples.size()<<"\n";
                for( auto debug = std::begin(_mems_mirrors[it]._matching_samples); debug != std::end(_mems_mirrors[it]._matching_samples); ++debug){
                  std::cout<<debug->id<<" is id "<<"\n";
                }
                */
              }
              break;
            }
          }
        }
        _mems_mirrors_randomrasterized.push_back(*_mems_mirrors.begin());
        std::cout<<"new mirrorvector has size: "<<_mems_mirrors_randomrasterized.size()<<"\n"<<"\n"<<"\n"<<"\n";

        }
        std::sort(_mems_mirrors.begin(), _mems_mirrors.end(), compare_by_idi);
        std::cout<<"give every mirror a sample ends now. "<<"\n";


      }